

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void conv_decode_print_iter(correct_convolutional *conv,uint iter,uint winner_index)

{
  long lVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint j;
  shift_register_t i_1;
  shift_register_t i;
  distance_t *errors;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if (0x8ab < in_ESI) {
    printf("iteration: %d\n",(ulong)in_ESI);
    lVar1 = *(long *)(*(long *)(in_RDI + 0x78) + 0x28);
    printf("errors:\n");
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x18) >> 1; local_1c = local_1c + 1) {
      printf("%2d: %d\n",(ulong)local_1c,(ulong)*(ushort *)(lVar1 + (ulong)local_1c * 2));
    }
    printf("\n");
    printf("history:\n");
    for (local_20 = 0; local_20 < *(uint *)(in_RDI + 0x18) >> 1; local_20 = local_20 + 1) {
      printf("%2d: ",(ulong)local_20);
      for (local_24 = 0; local_24 <= in_EDX; local_24 = local_24 + 1) {
        printf("%d",(ulong)(*(char *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x70) + 0x18) +
                                               (ulong)local_24 * 8) + (ulong)local_20) != '\0'));
      }
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

void conv_decode_print_iter(correct_convolutional *conv, unsigned int iter,
                            unsigned int winner_index) {
    if (iter < 2220) {
        return;
    }
    printf("iteration: %d\n", iter);
    distance_t *errors = conv->errors->write_errors;
    printf("errors:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: %d\n", i, errors[i]);
    }
    printf("\n");
    printf("history:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: ", i);
        for (unsigned int j = 0; j <= winner_index; j++) {
            printf("%d", conv->history_buffer->history[j][i] ? 1 : 0);
        }
        printf("\n");
    }
    printf("\n");
}